

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O2

void iutest::detail::
     DefaultPrintTo<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (undefined8 param_1,undefined8 *param_2,ostream *param_3)

{
  string *psVar1;
  long lVar2;
  string *str;
  
  std::operator<<(param_3,"{");
  str = (string *)*param_2;
  psVar1 = (string *)param_2[1];
  lVar2 = 0;
  do {
    if (str == psVar1) {
      if (lVar2 != 0) {
LAB_00120e5a:
        std::operator<<(param_3," ");
      }
      std::operator<<(param_3,"}");
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(param_3,","), lVar2 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_00120e5a;
    }
    std::operator<<(param_3," ");
    PrintTo(str,param_3);
    str = str + 1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

inline void DefaultPrintTo(IsContainerHelper::yes_t
                        , iutest_type_traits::false_type
                        , const T& container, iu_ostream* os)
{
    const size_t kMaxCount = kValues::MaxPrintContainerCount;
    size_t count = 0;
    *os << "{";
    for( typename T::const_iterator it=container.begin(), end=container.end(); it != end; ++it, ++count)
    {
        if( count > 0 )
        {
            *os << ",";
            if( count == kMaxCount )
            {
                *os << " ...";
                break;
            }
        }
        *os << " ";
        UniversalPrint(*it, os);
    }
    if( count > 0 )
    {
        *os << " ";
    }
    *os << "}";
}